

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reference.cpp
# Opt level: O0

void check_object_ref<debugger_type>(object_ref<debugger_type,_false> *ref,debugger_type *value)

{
  bool value_00;
  debugger_type *lhs;
  Decomposer local_459;
  debugger_type *local_458;
  BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&> local_450;
  StringRef local_420;
  SourceLineInfo local_410;
  StringRef local_400;
  undefined1 local_3f0 [8];
  AssertionHandler catchAssertionHandler_5;
  object_ref<debugger_type,_false> *local_3a0;
  BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&> local_398;
  StringRef local_368;
  SourceLineInfo local_358;
  StringRef local_348;
  undefined1 local_338 [8];
  AssertionHandler catchAssertionHandler_4;
  int *local_2e8;
  BinaryExpr<const_int_&,_const_int_&> local_2e0;
  StringRef local_2b0;
  SourceLineInfo local_2a0;
  StringRef local_290;
  undefined1 local_280 [8];
  AssertionHandler catchAssertionHandler_3;
  reference_type local_230;
  Decomposer local_221;
  debugger_type **local_220;
  BinaryExpr<debugger_type_*const_&,_const_debugger_type_*const_&> local_218;
  StringRef local_1e8;
  SourceLineInfo local_1d8;
  StringRef local_1c8;
  undefined1 local_1b8 [8];
  AssertionHandler catchAssertionHandler_2;
  reference_type local_168;
  Decomposer local_159;
  debugger_type **local_158;
  BinaryExpr<debugger_type_*const_&,_const_debugger_type_*const_&> local_150;
  StringRef local_120;
  SourceLineInfo local_110;
  StringRef local_100;
  undefined1 local_f0 [8];
  AssertionHandler catchAssertionHandler_1;
  Decomposer local_92;
  ExprLhs<bool> local_91;
  StringRef local_90;
  SourceLineInfo local_80;
  StringRef local_70;
  undefined1 local_60 [8];
  AssertionHandler catchAssertionHandler;
  debugger_type *value_local;
  object_ref<debugger_type,_false> *ref_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)value;
  local_70 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp"
             ,0x16);
  Catch::StringRef::StringRef(&local_90,"value.ctor()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_60,&local_70,&local_80,local_90,Normal);
  value_00 = debugger_type::ctor((debugger_type *)catchAssertionHandler.m_resultCapture);
  local_91 = Catch::Decomposer::operator<=(&local_92,value_00);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_60,&local_91);
  Catch::AssertionHandler::complete((AssertionHandler *)local_60);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_60);
  local_100 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp"
             ,0x17);
  Catch::StringRef::StringRef(&local_120,"&ref.get() == &value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_f0,&local_100,&local_110,local_120,Normal);
  local_168 = type_safe::object_ref<debugger_type,_false>::get(ref);
  local_158 = (debugger_type **)Catch::Decomposer::operator<=(&local_159,&local_168);
  catchAssertionHandler_2.m_resultCapture = catchAssertionHandler.m_resultCapture;
  Catch::ExprLhs<debugger_type*const&>::operator==
            (&local_150,(ExprLhs<debugger_type*const&> *)&local_158,
             (debugger_type **)&catchAssertionHandler_2.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_f0,&local_150.super_ITransientExpression);
  Catch::BinaryExpr<debugger_type_*const_&,_const_debugger_type_*const_&>::~BinaryExpr(&local_150);
  Catch::AssertionHandler::complete((AssertionHandler *)local_f0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_f0);
  local_1c8 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp"
             ,0x18);
  Catch::StringRef::StringRef(&local_1e8,"&*ref == &value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_1b8,&local_1c8,&local_1d8,local_1e8,Normal);
  local_230 = type_safe::object_ref<debugger_type,_false>::operator*(ref);
  local_220 = (debugger_type **)Catch::Decomposer::operator<=(&local_221,&local_230);
  catchAssertionHandler_3.m_resultCapture = catchAssertionHandler.m_resultCapture;
  Catch::ExprLhs<debugger_type*const&>::operator==
            (&local_218,(ExprLhs<debugger_type*const&> *)&local_220,
             (debugger_type **)&catchAssertionHandler_3.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_1b8,&local_218.super_ITransientExpression);
  Catch::BinaryExpr<debugger_type_*const_&,_const_debugger_type_*const_&>::~BinaryExpr(&local_218);
  Catch::AssertionHandler::complete((AssertionHandler *)local_1b8);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_1b8);
  local_290 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_2a0,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp"
             ,0x19);
  Catch::StringRef::StringRef(&local_2b0,"ref->id == value.id");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_280,&local_290,&local_2a0,local_2b0,Normal);
  lhs = type_safe::object_ref<debugger_type,_false>::operator->(ref);
  local_2e8 = (int *)Catch::Decomposer::operator<=
                               ((Decomposer *)((long)&catchAssertionHandler_4.m_resultCapture + 7),
                                &lhs->id);
  Catch::ExprLhs<int_const&>::operator==
            (&local_2e0,(ExprLhs<int_const&> *)&local_2e8,
             (int *)catchAssertionHandler.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_280,&local_2e0.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr(&local_2e0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_280);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_280);
  local_348 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_358,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp"
             ,0x1a);
  Catch::StringRef::StringRef(&local_368,"ref == value");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_338,&local_348,&local_358,local_368,Normal);
  local_3a0 = (object_ref<debugger_type,_false> *)
              Catch::Decomposer::operator<=
                        ((Decomposer *)((long)&catchAssertionHandler_5.m_resultCapture + 7),ref);
  Catch::ExprLhs<type_safe::object_ref<debugger_type,false>const&>::operator==
            (&local_398,(ExprLhs<type_safe::object_ref<debugger_type,false>const&> *)&local_3a0,
             (debugger_type *)catchAssertionHandler.m_resultCapture);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_338,&local_398.super_ITransientExpression);
  Catch::BinaryExpr<const_type_safe::object_ref<debugger_type,_false>_&,_const_debugger_type_&>::
  ~BinaryExpr(&local_398);
  Catch::AssertionHandler::complete((AssertionHandler *)local_338);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_338);
  local_400 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_410,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/reference.cpp"
             ,0x1b);
  Catch::StringRef::StringRef(&local_420,"value == ref");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_3f0,&local_400,&local_410,local_420,Normal);
  local_458 = (debugger_type *)
              Catch::Decomposer::operator<=
                        (&local_459,(debugger_type *)catchAssertionHandler.m_resultCapture);
  Catch::ExprLhs<debugger_type_const&>::operator==
            (&local_450,(ExprLhs<debugger_type_const&> *)&local_458,ref);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_3f0,&local_450.super_ITransientExpression);
  Catch::BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&>::
  ~BinaryExpr(&local_450);
  Catch::AssertionHandler::complete((AssertionHandler *)local_3f0);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_3f0);
  return;
}

Assistant:

void check_object_ref(const object_ref<T>& ref, const debugger_type& value)
{
    REQUIRE(value.ctor());
    REQUIRE(&ref.get() == &value);
    REQUIRE(&*ref == &value);
    REQUIRE(ref->id == value.id);
    REQUIRE(ref == value);
    REQUIRE(value == ref);
}